

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall cmGlobalUnixMakefileGenerator3::Generate(cmGlobalUnixMakefileGenerator3 *this)

{
  _Rb_tree_header *p_Var1;
  pointer ppcVar2;
  cmLocalGenerator *this_00;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  char *pcVar5;
  ostream *poVar6;
  uint uVar7;
  unsigned_long total;
  iterator pmi;
  unsigned_long current;
  string markFileName;
  cmGeneratedFileStream markFile;
  unsigned_long local_2a0;
  char *local_298 [4];
  allocator local_278 [584];
  
  cmGlobalGenerator::Generate((cmGlobalGenerator *)this);
  p_Var1 = &(this->ProgressMap)._M_t._M_impl.super__Rb_tree_header;
  total = 0;
  p_Var4 = (this->ProgressMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var3 = p_Var4; (_Rb_tree_header *)p_Var3 != p_Var1;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    total = (long)&(p_Var3[1]._M_parent)->_M_color + total;
  }
  local_2a0 = 0;
  for (; (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    TargetProgress::WriteProgressVariables((TargetProgress *)&p_Var4[1]._M_parent,total,&local_2a0);
  }
  uVar7 = 0;
  while( true ) {
    ppcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar2 >> 3) <=
        (ulong)uVar7) break;
    this_00 = ppcVar2[uVar7];
    pcVar5 = cmLocalGenerator::GetCurrentBinaryDirectory(this_00);
    std::__cxx11::string::string((string *)local_298,pcVar5,local_278);
    std::__cxx11::string::append((char *)local_298);
    std::__cxx11::string::append((char *)local_298);
    std::__cxx11::string::append((char *)local_298);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_278,local_298[0],false);
    CountProgressMarksInAll(this,this_00);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_278);
    std::operator<<(poVar6,"\n");
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
    std::__cxx11::string::~string((string *)local_298);
    uVar7 = uVar7 + 1;
  }
  WriteMainMakefile2(this);
  WriteMainCMakefile(this);
  if (this->CommandDatabase != (cmGeneratedFileStream *)0x0) {
    poVar6 = std::endl<char,std::char_traits<char>>((ostream *)this->CommandDatabase);
    std::operator<<(poVar6,"]");
    if (this->CommandDatabase != (cmGeneratedFileStream *)0x0) {
      (*(this->CommandDatabase->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
        _vptr_basic_ostream[1])();
    }
    this->CommandDatabase = (cmGeneratedFileStream *)0x0;
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::Generate()
{
  // first do superclass method
  this->cmGlobalGenerator::Generate();

  // initialize progress
  unsigned long total = 0;
  for(ProgressMapType::const_iterator pmi = this->ProgressMap.begin();
      pmi != this->ProgressMap.end(); ++pmi)
    {
    total += pmi->second.NumberOfActions;
    }

  // write each target's progress.make this loop is done twice. Bascially the
  // Generate pass counts all the actions, the first loop below determines
  // how many actions have progress updates for each target and writes to
  // corrrect variable values for everything except the all targets. The
  // second loop actually writes out correct values for the all targets as
  // well. This is because the all targets require more information that is
  // computed in the first loop.
  unsigned long current = 0;
  for(ProgressMapType::iterator pmi = this->ProgressMap.begin();
      pmi != this->ProgressMap.end(); ++pmi)
    {
    pmi->second.WriteProgressVariables(total, current);
    }
  for(unsigned int i = 0; i < this->LocalGenerators.size(); ++i)
    {
    cmLocalGenerator *lg = this->LocalGenerators[i];
    std::string markFileName = lg->GetCurrentBinaryDirectory();
    markFileName += "/";
    markFileName += cmake::GetCMakeFilesDirectory();
    markFileName += "/progress.marks";
    cmGeneratedFileStream markFile(markFileName.c_str());
    markFile << this->CountProgressMarksInAll(lg) << "\n";
    }

  // write the main makefile
  this->WriteMainMakefile2();
  this->WriteMainCMakefile();

  if (this->CommandDatabase != NULL) {
    *this->CommandDatabase << std::endl << "]";
    delete this->CommandDatabase;
    this->CommandDatabase = NULL;
  }
}